

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O2

int __thiscall tetgenmesh::facetfacetadjacent(tetgenmesh *this,face *subsh1,face *subsh2)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  point *ppdVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  iVar2 = *(int *)((long)subsh1->sh + (long)this->shmarkindex * 4 + 8);
  iVar3 = *(int *)((long)subsh2->sh + (long)this->shmarkindex * 4 + 8);
  uVar6 = 0;
  if (iVar2 != iVar3) {
    piVar4 = this->idx2facetlist;
    ppdVar5 = this->facetverticeslist;
    for (lVar9 = (long)piVar4[iVar2]; uVar8 = (ulong)piVar4[(long)iVar2 + 1], lVar9 < (long)uVar8;
        lVar9 = lVar9 + 1) {
      puVar1 = (uint *)((long)ppdVar5[lVar9] + (long)this->pointmarkindex * 4 + 4);
      *puVar1 = *puVar1 | 1;
    }
    ppdVar5 = this->facetverticeslist;
    iVar7 = 0;
    for (lVar9 = (long)piVar4[iVar3]; lVar9 < piVar4[(long)iVar3 + 1]; lVar9 = lVar9 + 1) {
      iVar7 = iVar7 + (*(uint *)((long)ppdVar5[lVar9] + (long)this->pointmarkindex * 4 + 4) & 1);
    }
    for (lVar9 = (long)piVar4[iVar2]; lVar9 < (int)uVar8; lVar9 = lVar9 + 1) {
      puVar1 = (uint *)((long)ppdVar5[lVar9] + (long)this->pointmarkindex * 4 + 4);
      *puVar1 = *puVar1 & 0xfffffffe;
      uVar8 = (ulong)(uint)piVar4[(long)iVar2 + 1];
    }
    uVar6 = (uint)(0 < iVar7);
  }
  return uVar6;
}

Assistant:

inline int tetgenmesh::getfacetindex(face& s)
{
  return ((int *) (s.sh))[shmarkindex + 2];
}